

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_queue_examples.cpp
# Opt level: O1

void density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::
     func_queue_reentrant_put_samples(ostream *i_ostream)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  long lVar5;
  undefined8 *puVar6;
  void *pvVar7;
  int iVar8;
  type return_value;
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  queue;
  anon_class_8_1_90f47376 func;
  double last_val;
  PrintScopeDuration dur;
  reentrant_put_transaction<Func> local_d0;
  reentrant_put_transaction<Func> local_b8;
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  local_a0;
  reentrant_put_transaction<Func> local_90;
  Func_conflict local_78;
  PrintScopeDuration local_60;
  
  PrintScopeDuration::PrintScopeDuration(&local_60,i_ostream,"function queue reentrant put samples")
  ;
  local_b8.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)&DAT_0000ffef;
  local_b8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(anon_class_1_0_00000001 *)&local_d0);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(anon_class_1_0_00000001 *)&local_d0);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(anon_class_1_0_00000001 *)&local_d0);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(anon_class_1_0_00000001 *)&local_d0);
  do {
    bVar2 = density::
            function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_reentrant_consume_impl
                      ((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                        *)&local_b8);
  } while (bVar2);
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                     *)&local_b8);
  local_a0.m_queue.m_head = (ControlBlock *)&local_90;
  local_90.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x3ff0000000000000;
  local_b8.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)&DAT_0000ffef;
  local_b8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  iVar8 = 10;
  do {
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,double()>,density::basic_default_allocator<65536ul>>
    ::
    reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_,density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_&>
              ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,double()>,density::basic_default_allocator<65536ul>>
                *)&local_b8,(anon_class_8_1_90f47376 *)&local_a0);
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  do {
    density::
    function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::try_reentrant_consume_impl
              ((function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                *)&local_d0,&local_b8);
    cVar1 = (char)local_d0.m_put_data.m_control_block;
    if ((char)local_d0.m_put_data.m_control_block == '\0') break;
    poVar3 = std::ostream::_M_insert<double>((double)local_d0.m_queue);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  } while (cVar1 != '\0');
  density::
  function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~function_queue((function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                     *)&local_b8);
  local_b8.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)&DAT_0000ffef;
  local_b8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_d0.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)CONCAT44(local_d0.m_queue._4_4_,7);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(int *)&local_d0);
  bVar2 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_reentrant_consume_impl
                    ((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                      *)&local_b8);
  if (!bVar2) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0xf7,
                  "static void density_tests::FunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  density::
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
  ::~function_queue((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
                     *)&local_b8);
  local_a0.m_queue.m_head = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_queue.m_tail = (ControlBlock *)&DAT_0000ffef;
  local_78.m_string_1 = (char *)0x0;
  local_78.m_string_2 = (char *)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
  ::
  start_reentrant_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            (&local_b8,
             (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
              *)&local_a0,&local_78);
  local_90.m_queue = local_b8.m_queue;
  local_90.m_put_data.m_control_block = local_b8.m_put_data.m_control_block;
  local_90.m_put_data.m_user_storage = local_b8.m_put_data.m_user_storage;
  local_b8.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_b8);
  local_d0.m_queue = local_90.m_queue;
  local_d0.m_put_data.m_control_block = local_90.m_put_data.m_control_block;
  local_d0.m_put_data.m_user_storage = local_90.m_put_data.m_user_storage;
  local_90.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_90);
  pvVar4 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate(&local_d0,0xc,1);
  lVar5 = 0;
  do {
    *(char *)((long)pvVar4 + lVar5) = "Hello world"[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xc);
  puVar6 = (undefined8 *)
           density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element_ptr(&local_d0);
  *puVar6 = pvVar4;
  pvVar4 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::raw_allocate(&local_d0,0x12,1);
  lVar5 = 0;
  do {
    *(char *)((long)pvVar4 + lVar5) = "\t(I\'m so happy)!!"[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x12);
  pvVar7 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::reentrant_put_transaction<Func>::element_ptr(&local_d0);
  *(void **)((long)pvVar7 + 8) = pvVar4;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::reentrant_put_transaction<Func>::commit(&local_d0);
  bVar2 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
          ::try_reentrant_consume_impl(&local_a0);
  if (bVar2) {
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_d0);
    density::
    function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
    ::~function_queue(&local_a0);
    local_a0.m_queue.m_head = (ControlBlock *)&DAT_0000ffef;
    local_a0.m_queue.m_tail = (ControlBlock *)&DAT_0000ffef;
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
    ::
    start_reentrant_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
              (&local_b8,
               (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>>
                *)&local_a0);
    local_90.m_queue = local_b8.m_queue;
    local_90.m_put_data.m_control_block = local_b8.m_put_data.m_control_block;
    local_90.m_put_data.m_user_storage = local_b8.m_put_data.m_user_storage;
    local_b8.m_queue =
         (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)0x0;
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_b8);
    local_d0.m_queue = local_90.m_queue;
    local_d0.m_put_data.m_control_block = local_90.m_put_data.m_control_block;
    local_d0.m_put_data.m_user_storage = local_90.m_put_data.m_user_storage;
    local_90.m_queue =
         (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)0x0;
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_90);
    pvVar4 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_put_transaction<Func>::raw_allocate(&local_d0,0xc,1);
    lVar5 = 0;
    do {
      *(char *)((long)pvVar4 + lVar5) = "Hello world"[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xc);
    puVar6 = (undefined8 *)
             density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_put_transaction<Func>::element_ptr(&local_d0);
    *puVar6 = pvVar4;
    pvVar4 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_put_transaction<Func>::raw_allocate(&local_d0,0x12,1);
    lVar5 = 0;
    do {
      *(char *)((long)pvVar4 + lVar5) = "\t(I\'m so happy)!!"[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x12);
    pvVar7 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::reentrant_put_transaction<Func>::element_ptr(&local_d0);
    *(void **)((long)pvVar7 + 8) = pvVar4;
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::reentrant_put_transaction<Func>::commit(&local_d0);
    bVar2 = density::
            function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
            ::try_reentrant_consume_impl(&local_a0);
    if (bVar2) {
      density::
      heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_d0);
      density::
      function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)1>
      ::~function_queue(&local_a0);
      PrintScopeDuration::~PrintScopeDuration(&local_60);
      return;
    }
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0x135,
                  "static void density_tests::FunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
                 );
  }
  __assert_fail("invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                ,0x117,
                "static void density_tests::FunctionQueueSamples<density::function_manual_clear>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_manual_clear]"
               );
}

Assistant:

static void func_queue_reentrant_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "function queue reentrant put samples");

            using namespace density;

            {
                //! [function_queue reentrant_push example 1]
                function_queue<void(), default_allocator, ERASURE> queue;
                queue.reentrant_push([] { std::cout << "Hello"; });
                queue.reentrant_push([] { std::cout << " world"; });
                queue.reentrant_push([] { std::cout << "!!!"; });
                queue.reentrant_push([] { std::cout << std::endl; });
                while (queue.try_reentrant_consume())
                    ;
                //! [function_queue reentrant_push example 1]
            }
            {
                //! [function_queue reentrant_push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                function_queue<double(), default_allocator, ERASURE> queue;
                for (int i = 0; i < 10; i++)
                    queue.reentrant_push(func);

                while (auto const return_value = queue.try_reentrant_consume())
                    std::cout << *return_value << std::endl;
                //! [function_queue reentrant_push example 2]
            }
            {
                //! [function_queue reentrant_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;
                queue.template reentrant_emplace<Func>(7);

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue reentrant_emplace example 1]
                (void)invoked;
            }
            {
                //! [function_queue start_reentrant_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;

                auto transaction = queue.start_reentrant_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                // now transaction is empty

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue start_reentrant_push example 1]
                (void)invoked;
            }
            {
                //! [function_queue start_reentrant_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;

                auto transaction = queue.template start_reentrant_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [function_queue start_reentrant_emplace example 1]
                (void)invoked;
            }
        }